

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3443::EvaluateSectionFrame
          (ChElementShellANCF_3443 *this,double xi,double eta,ChVector<double> *point,
          ChQuaternion<double> *rot)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  undefined1 auVar40 [16];
  double dVar41;
  double dVar42;
  ChVector<double> MidsurfaceY;
  ChVector<double> MidsurfaceX;
  VectorN Sxi_eta_compact;
  VectorN Sxi_compact;
  VectorN Sxi_xi_compact;
  Matrix3xN e_bar;
  ChVector<double> local_3f8;
  Matrix3xN *local_3e0;
  Matrix3xN *local_3d8;
  VectorN *local_3d0;
  undefined8 local_3c0;
  double local_3a8;
  ChVector<double> local_398;
  VectorN local_380;
  VectorN local_300;
  VectorN local_280;
  Matrix3xN local_200;
  
  dVar28 = this->m_thicknessZ;
  dVar10 = this->m_midsurfoffset;
  Calc_Sxi_compact(this,&local_300,xi,eta,0.0,dVar28,dVar10);
  Calc_Sxi_xi_compact(this,&local_280,xi,eta,0.0,dVar28,dVar10);
  Calc_Sxi_eta_compact(this,&local_380,xi,eta,0.0,dVar28,dVar10);
  CalcCoordMatrix(this,&local_200);
  local_3d8 = (Matrix3xN *)&local_300;
  local_3e0 = &local_200;
  ChVector<double>::operator=
            (point,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_Eigen::Matrix<double,_16,_1,_0,_16,_1>,_0>_>
                    *)&local_3e0);
  local_3a8 = this->m_lenX;
  local_3c0 = 0x4000000000000000;
  local_3d8 = &local_200;
  local_3d0 = &local_280;
  ChVector<double>::
  ChVector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,1,0,16,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&local_398,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_Eigen::Matrix<double,_16,_1,_0,_16,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_3e0,(type *)0x0);
  local_3a8 = this->m_lenY;
  local_3d0 = &local_380;
  local_3c0 = 0x4000000000000000;
  local_3d8 = &local_200;
  ChVector<double>::
  ChVector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,1,0,16,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&local_3f8,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_Eigen::Matrix<double,_16,_1,_0,_16,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_3e0,(type *)0x0);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_398.m_data[0];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_398.m_data[2];
  auVar6 = ZEXT816(0) << 0x40;
  if ((((local_398.m_data[0] != 0.0) || (NAN(local_398.m_data[0]))) || (local_398.m_data[1] != 0.0))
     || (((NAN(local_398.m_data[1]) || (local_398.m_data[2] != 0.0)) || (NAN(local_398.m_data[2]))))
     ) {
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_398.m_data[1] * local_398.m_data[1];
    auVar6 = vfmadd231sd_fma(auVar12,auVar8,auVar8);
    auVar6 = vfmadd231sd_fma(auVar6,auVar25,auVar25);
    auVar6 = vsqrtsd_avx(auVar6,auVar6);
    bVar4 = 2.2250738585072014e-308 <= auVar6._0_8_;
    dVar28 = 1.0 / auVar6._0_8_;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (ulong)bVar4 * (long)(local_398.m_data[2] * dVar28);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (ulong)bVar4 * (long)(local_398.m_data[1] * dVar28);
    auVar7._0_8_ = (ulong)bVar4 * (long)(local_398.m_data[0] * dVar28) +
                   (ulong)!bVar4 * 0x3ff0000000000000;
    auVar7._8_8_ = 0;
  }
  else {
    auVar7 = ZEXT816(0x3ff0000000000000);
    auVar5 = ZEXT816(0) << 0x40;
  }
  dVar42 = auVar5._0_8_;
  dVar41 = auVar6._0_8_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_3f8.m_data[2];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_3f8.m_data[0];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_3f8.m_data[1];
  dVar9 = auVar7._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_3f8.m_data[2] * dVar9;
  auVar8 = vfmsub231sd_fma(auVar26,auVar5,auVar35);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar42 * local_3f8.m_data[1];
  auVar25 = vfmsub231sd_fma(auVar21,auVar6,auVar30);
  dVar28 = auVar25._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar41 * local_3f8.m_data[0];
  auVar12 = vfmsub231sd_fma(auVar17,auVar7,auVar32);
  dVar10 = auVar12._0_8_;
  dVar24 = auVar8._0_8_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar24 * dVar24;
  auVar8 = vfmadd231sd_fma(auVar37,auVar25,auVar25);
  auVar8 = vfmadd231sd_fma(auVar8,auVar12,auVar12);
  auVar8 = vsqrtsd_avx(auVar8,auVar8);
  dVar29 = auVar8._0_8_;
  if (dVar29 < 0.0001) {
    auVar1._8_8_ = 0x7fffffffffffffff;
    auVar1._0_8_ = 0x7fffffffffffffff;
    auVar8 = vandpd_avx512vl(auVar35,auVar1);
    if (0.9 <= auVar8._0_8_) {
      auVar2._8_8_ = 0x7fffffffffffffff;
      auVar2._0_8_ = 0x7fffffffffffffff;
      auVar8 = vandpd_avx512vl(auVar32,auVar2);
      if (0.9 <= auVar8._0_8_) {
        auVar3._8_8_ = 0x7fffffffffffffff;
        auVar3._0_8_ = 0x7fffffffffffffff;
        auVar8 = vandpd_avx512vl(auVar30,auVar3);
        auVar25 = ZEXT816(0);
        if (0.9 <= auVar8._0_8_) goto LAB_00779ab9;
        auVar8 = ZEXT816(0x3ff0000000000000);
      }
      else {
        auVar25 = ZEXT816(0x3ff0000000000000);
LAB_00779ab9:
        auVar8 = ZEXT816(0);
      }
      auVar12 = ZEXT816(0);
    }
    else {
      auVar12 = ZEXT816(0x3ff0000000000000);
      auVar8 = ZEXT816(0);
      auVar25 = ZEXT816(0);
    }
    auVar27._8_8_ = 0;
    auVar27._0_8_ = auVar8._0_8_ * -dVar9;
    auVar17 = vfmadd231sd_fma(auVar27,auVar5,auVar12);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = auVar25._0_8_ * -dVar42;
    auVar8 = vfmadd231sd_fma(auVar22,auVar6,auVar8);
    dVar28 = auVar8._0_8_;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = auVar12._0_8_ * -dVar41;
    auVar25 = vfmadd231sd_fma(auVar18,auVar7,auVar25);
    dVar10 = auVar25._0_8_;
    dVar24 = auVar17._0_8_;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar24 * dVar24;
    auVar8 = vfmadd231sd_fma(auVar31,auVar8,auVar8);
    auVar8 = vfmadd231sd_fma(auVar8,auVar25,auVar25);
    auVar8 = vsqrtsd_avx(auVar8,auVar8);
    dVar29 = auVar8._0_8_;
  }
  dVar29 = 1.0 / dVar29;
  dVar28 = dVar28 * dVar29;
  dVar10 = dVar10 * dVar29;
  dVar24 = dVar24 * dVar29;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar10;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar42 * dVar28;
  auVar8 = vfmsub231sd_fma(auVar23,auVar19,auVar7);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar41 * dVar10;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar24;
  auVar25 = vfmsub231sd_fma(auVar36,auVar38,auVar5);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar28;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar9 * dVar24;
  auVar6 = vfmsub231sd_fma(auVar40,auVar33,auVar6);
  dVar20 = auVar8._0_8_;
  dVar29 = dVar10 + dVar9 + dVar20;
  dVar34 = auVar25._0_8_;
  dVar39 = auVar6._0_8_;
  if (0.0 <= dVar29) {
    dVar29 = dVar29 + 1.0;
    if (dVar29 < 0.0) {
      dVar10 = sqrt(dVar29);
    }
    else {
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar29;
      auVar6 = vsqrtsd_avx(auVar14,auVar14);
      dVar10 = auVar6._0_8_;
    }
    dVar20 = dVar10 * 0.5;
    dVar10 = 0.5 / dVar10;
    dVar29 = (dVar39 - dVar24) * dVar10;
    dVar9 = (dVar28 - dVar42) * dVar10;
    dVar10 = (dVar41 - dVar34) * dVar10;
    goto LAB_00779da4;
  }
  if (dVar20 <= dVar9) {
    if (dVar9 < dVar10) goto LAB_00779b84;
    dVar10 = ((dVar9 - dVar20) - dVar10) + 1.0;
    if (dVar10 < 0.0) {
      dVar11 = sqrt(dVar10);
    }
    else {
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar10;
      auVar6 = vsqrtsd_avx(auVar16,auVar16);
      dVar11 = auVar6._0_8_;
    }
    dVar20 = dVar39 - dVar24;
    dVar29 = dVar11 * 0.5;
    dVar11 = 0.5 / dVar11;
    dVar9 = (dVar41 + dVar34) * dVar11;
    dVar10 = (dVar42 + dVar28) * dVar11;
  }
  else if (dVar20 < dVar10) {
LAB_00779b84:
    dVar10 = ((dVar10 - dVar9) - dVar20) + 1.0;
    if (dVar10 < 0.0) {
      dVar11 = sqrt(dVar10);
    }
    else {
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar10;
      auVar6 = vsqrtsd_avx(auVar15,auVar15);
      dVar11 = auVar6._0_8_;
    }
    dVar20 = dVar41 - dVar34;
    dVar10 = dVar11 * 0.5;
    dVar11 = 0.5 / dVar11;
    dVar29 = (dVar42 + dVar28) * dVar11;
    dVar9 = (dVar39 + dVar24) * dVar11;
  }
  else {
    dVar10 = ((dVar20 - dVar10) - dVar9) + 1.0;
    if (dVar10 < 0.0) {
      dVar11 = sqrt(dVar10);
    }
    else {
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dVar10;
      auVar6 = vsqrtsd_avx(auVar13,auVar13);
      dVar11 = auVar6._0_8_;
    }
    dVar20 = dVar28 - dVar42;
    dVar9 = dVar11 * 0.5;
    dVar11 = 0.5 / dVar11;
    dVar10 = (dVar39 + dVar24) * dVar11;
    dVar29 = (dVar41 + dVar34) * dVar11;
  }
  dVar20 = dVar20 * dVar11;
LAB_00779da4:
  rot->m_data[0] = dVar20;
  rot->m_data[1] = dVar29;
  rot->m_data[2] = dVar9;
  rot->m_data[3] = dVar10;
  return;
}

Assistant:

void ChElementShellANCF_3443::EvaluateSectionFrame(const double xi,
                                                   const double eta,
                                                   ChVector<>& point,
                                                   ChQuaternion<>& rot) {
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, eta, 0, m_thicknessZ, m_midsurfoffset);
    VectorN Sxi_xi_compact;
    Calc_Sxi_xi_compact(Sxi_xi_compact, xi, eta, 0, m_thicknessZ, m_midsurfoffset);
    VectorN Sxi_eta_compact;
    Calc_Sxi_eta_compact(Sxi_eta_compact, xi, eta, 0, m_thicknessZ, m_midsurfoffset);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // r = S*e written in compact form
    point = e_bar * Sxi_compact;

    // Since ANCF does not use rotations, calculate an approximate
    // rotation based off the position vector gradients
    ChVector<double> MidsurfaceX = e_bar * Sxi_xi_compact * 2 / m_lenX;
    ChVector<double> MidsurfaceY = e_bar * Sxi_eta_compact * 2 / m_lenY;

    // Since the position vector gradients are not in general orthogonal,
    // set the Dx direction tangent to the shell xi axis and
    // compute the Dy and Dz directions by using a
    // Gram-Schmidt orthonormalization, guided by the shell eta axis
    ChMatrix33<> msect;
    msect.Set_A_Xdir(MidsurfaceX, MidsurfaceY);

    rot = msect.Get_A_quaternion();
}